

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ancientzip.cpp
# Opt level: O3

int __thiscall
FZipExploder::DecodeSF
          (FZipExploder *this,TArray<FZipExploder::HuffNode,_FZipExploder::HuffNode> *decoder,
          int numvals)

{
  byte bVar1;
  uint uVar2;
  uint uVar3;
  byte bVar4;
  long lVar5;
  FZipExploder *pFVar6;
  long lVar7;
  long lVar8;
  bool bVar9;
  TableBuilder builder [256];
  TableBuilder local_438 [258];
  
  pFVar6 = this;
  if (this->InLeft == 0) {
    bVar1 = 0;
  }
  else {
    this->InLeft = this->InLeft - 1;
    uVar2 = this->bs;
    if (uVar2 < this->be) {
      this->bs = uVar2 + 1;
      bVar1 = this->ReadBuf[uVar2];
    }
    else {
      pFVar6 = (FZipExploder *)this->In;
      uVar2 = (**(code **)(*(long *)pFVar6 + 0x10))(pFVar6,this->ReadBuf,0x100);
      this->be = uVar2;
      bVar1 = this->ReadBuf[0];
      this->bs = 1;
    }
  }
  lVar8 = 0;
  uVar2 = 0;
  do {
    if (this->InLeft == 0) {
      bVar4 = 0;
    }
    else {
      this->InLeft = this->InLeft - 1;
      uVar3 = this->bs;
      if (uVar3 < this->be) {
        this->bs = uVar3 + 1;
        bVar4 = this->ReadBuf[uVar3];
      }
      else {
        pFVar6 = (FZipExploder *)this->In;
        uVar3 = (**(code **)(*(long *)pFVar6 + 0x10))(pFVar6,this->ReadBuf,0x100);
        this->be = uVar3;
        bVar4 = this->ReadBuf[0];
        this->bs = 1;
      }
    }
    lVar7 = (long)(int)lVar8;
    lVar5 = 0;
    lVar8 = lVar7;
    do {
      (&local_438[lVar7].Length)[lVar5] = (bVar4 & 0xf) + 1;
      (&local_438[lVar7].Value)[lVar5] = (uchar)lVar8;
      lVar8 = lVar8 + 1;
      lVar5 = lVar5 + 4;
    } while ((bVar4 >> 2 & 0x3c) + 4 != (int)lVar5);
    bVar9 = uVar2 != bVar1;
    uVar2 = uVar2 + 1;
  } while (bVar9);
  bVar9 = numvals != (int)lVar8;
  if (!bVar9) {
    BuildDecoder(pFVar6,decoder,local_438,numvals);
  }
  return (uint)bVar9;
}

Assistant:

int FZipExploder::DecodeSF(TArray<HuffNode> &decoder, int numvals)
{
	TableBuilder builder[256];
	unsigned char a, c;
	int i, n, v = 0;

	READBYTE(c);
	n = c + 1;
	for (i = 0; i < n; i++) {
		int nv, bl;
		READBYTE(a);
		nv = ((a >> 4) & 15) + 1;
		bl = (a & 15) + 1;
		while (nv--) {
			builder[v].Length = bl;
			builder[v].Value = v;
			v++;
		}
	}
	if (v != numvals)
		return 1;	/* bad table */
	return BuildDecoder(decoder, builder, v);
}